

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

string * __thiscall iDynTree::Transform::toString_abi_cxx11_(Transform *this)

{
  ostream *poVar1;
  string *in_RDI;
  Rotation *in_stack_00000008;
  stringstream ss;
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [320];
  Position *in_stack_ffffffffffffffb8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  Rotation::toString_abi_cxx11_(in_stack_00000008);
  poVar1 = std::operator<<(local_188,local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  Position::toString_abi_cxx11_(in_stack_ffffffffffffffb8);
  std::operator<<(poVar1,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1b8);
  std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string Transform::toString() const
{
    std::stringstream ss;

    ss << rot.toString() << " "
       << pos.toString();

    ss << std::endl;

    return ss.str();
}